

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

char __thiscall absl::lts_20250127::Cord::operator[](Cord *this,size_t i)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  uVar4 = (ulong)(char)bVar1;
  if ((uVar4 & 1) == 0) {
    uVar5 = uVar4 >> 1;
  }
  else {
    uVar5 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (i < uVar5) {
    pCVar2 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar2 == (CordRepBtree *)0x0 || (bVar1 & 1) == 0) {
      pcVar6 = (char *)0x0;
      if ((uVar4 & 1) == 0) {
        pcVar6 = (this->contents_).data_.rep_.field_0.data + 1;
      }
      return pcVar6[i];
    }
    this = (Cord *)pCVar2;
    if ((pCVar2->super_CordRep).tag != '\x02') goto LAB_0031d26a;
    this = (Cord *)pCVar2->edges_[0];
  }
  else {
    operator[]();
  }
  while( true ) {
    if ((CordRepBtree *)this == (CordRepBtree *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x48d,"char absl::Cord::operator[](size_t) const");
    }
LAB_0031d26a:
    if ((undefined1 *)(((CordRepBtree *)this)->super_CordRep).length <= i) {
      __assert_fail("offset < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x48e,"char absl::Cord::operator[](size_t) const");
    }
    bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
    if (5 < bVar1) {
      if (bVar1 < 0xf9) {
        return *(uint8_t *)(i + (long)(((CordRepBtree *)this)->super_CordRep).storage);
      }
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    if (bVar1 != 1) break;
    i = (size_t)(((CordRepBtree *)this)->edges_[0]->storage + (long)(i + -0xd));
    this = (Cord *)((CordRepBtree *)this)->edges_[1];
  }
  if (bVar1 == 5) {
    return ((CordRepBtree *)this)->edges_[0]->storage[(long)(i + -0xd)];
  }
  if (bVar1 != 3) {
    __assert_fail("rep->IsSubstring()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x499,"char absl::Cord::operator[](size_t) const");
  }
  cVar3 = cord_internal::CordRepBtree::GetCharacter((CordRepBtree *)this,i);
  return cVar3;
}

Assistant:

char Cord::operator[](size_t i) const {
  ABSL_HARDENING_ASSERT(i < size());
  size_t offset = i;
  const CordRep* rep = contents_.tree();
  if (rep == nullptr) {
    return contents_.data()[i];
  }
  rep = cord_internal::SkipCrcNode(rep);
  while (true) {
    assert(rep != nullptr);
    assert(offset < rep->length);
    if (rep->IsFlat()) {
      // Get the "i"th character directly from the flat array.
      return rep->flat()->Data()[offset];
    } else if (rep->IsBtree()) {
      return rep->btree()->GetCharacter(offset);
    } else if (rep->IsExternal()) {
      // Get the "i"th character from the external array.
      return rep->external()->base[offset];
    } else {
      // This must be a substring a node, so bypass it to get to the child.
      assert(rep->IsSubstring());
      offset += rep->substring()->start;
      rep = rep->substring()->child;
    }
  }
}